

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void transpose4x8_8x4_low_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *d0,__m128i *d1,__m128i *d2,
               __m128i *d3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i alVar3;
  __m128i w1;
  __m128i w0;
  __m128i *d1_local;
  __m128i *d0_local;
  __m128i *x3_local;
  __m128i *x2_local;
  __m128i *x1_local;
  __m128i *x0_local;
  
  auVar1 = vpunpcklbw_avx((undefined1  [16])*x0,(undefined1  [16])*x1);
  auVar2 = vpunpcklbw_avx((undefined1  [16])*x2,(undefined1  [16])*x3);
  alVar3 = (__m128i)vpunpcklwd_avx(auVar1,auVar2);
  *d0 = alVar3;
  alVar3 = (__m128i)vpsrldq_avx((undefined1  [16])*d0,4);
  *d1 = alVar3;
  alVar3 = (__m128i)vpsrldq_avx((undefined1  [16])*d0,8);
  *d2 = alVar3;
  alVar3 = (__m128i)vpsrldq_avx((undefined1  [16])*d0,0xc);
  *d3 = alVar3;
  return;
}

Assistant:

static inline void transpose4x8_8x4_low_sse2(__m128i *x0, __m128i *x1,
                                             __m128i *x2, __m128i *x3,
                                             __m128i *d0, __m128i *d1,
                                             __m128i *d2, __m128i *d3) {
  // input
  // x0   00 01 02 03 04 05 06 07 xx xx xx xx xx xx xx xx
  // x1   10 11 12 13 14 15 16 17 xx xx xx xx xx xx xx xx
  // x2   20 21 22 23 24 25 26 27 xx xx xx xx xx xx xx xx
  // x3   30 31 32 33 34 35 36 37 xx xx xx xx xx xx xx xx
  // output
  // 00 10 20 30 xx xx xx xx xx xx xx xx xx xx xx xx
  // 01 11 21 31 xx xx xx xx xx xx xx xx xx xx xx xx
  // 02 12 22 32 xx xx xx xx xx xx xx xx xx xx xx xx
  // 03 13 23 33 xx xx xx xx xx xx xx xx xx xx xx xx

  __m128i w0, w1;

  w0 = _mm_unpacklo_epi8(
      *x0, *x1);  // 00 10 01 11 02 12 03 13 04 14 05 15 06 16 07 17
  w1 = _mm_unpacklo_epi8(
      *x2, *x3);  // 20 30 21 31 22 32 23 33 24 34 25 35 26 36 27 37

  *d0 = _mm_unpacklo_epi16(
      w0, w1);  // 00 10 20 30 01 11 21 31 02 12 22 32 03 13 23 33

  *d1 = _mm_srli_si128(*d0,
                       4);  // 01 11 21 31 xx xx xx xx xx xx xx xx xx xx xx xx
  *d2 = _mm_srli_si128(*d0,
                       8);  // 02 12 22 32 xx xx xx xx xx xx xx xx xx xx xx xx
  *d3 = _mm_srli_si128(*d0,
                       12);  // 03 13 23 33 xx xx xx xx xx xx xx xx xx xx xx xx
}